

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O0

int EDCircles::inverse(double **TB,double **InvB,int N)

{
  double dVar1;
  double **m;
  double **m_00;
  double **m_01;
  double eps;
  double **C;
  double **A;
  double **B;
  double dStack_58;
  int npivot;
  double maxpivot;
  double temp;
  double D;
  double mult;
  int q;
  int p;
  int j;
  int i;
  int k;
  int N_local;
  double **InvB_local;
  double **TB_local;
  
  m = AllocateMatrix(N + 1,N + 2);
  m_00 = AllocateMatrix(N + 1,N * 2 + 2);
  m_01 = AllocateMatrix(N + 1,N + 1);
  for (j = 1; j <= N; j = j + 1) {
    for (q = 1; q <= N; q = q + 1) {
      m[j][q] = TB[j][q];
    }
  }
  for (j = 1; j <= N; j = j + 1) {
    for (q = 1; q <= N + 1; q = q + 1) {
      m_00[j][q] = m[j][q];
    }
    for (q = N + 2; q <= N * 2 + 1; q = q + 1) {
      m_00[j][q] = 0.0;
    }
    m_00[j][j + N + 1] = 1.0;
  }
  j = 1;
  while( true ) {
    if (N < j) {
      mult._4_4_ = 1;
      for (j = 1; j <= N; j = j + 1) {
        mult._0_4_ = 1;
        for (q = N + 2; q <= N * 2 + 1; q = q + 1) {
          InvB[mult._4_4_][mult._0_4_] = m_00[j][q];
          mult._0_4_ = mult._0_4_ + 1;
        }
        mult._4_4_ = mult._4_4_ + 1;
      }
      DeallocateMatrix(m,N + 1);
      DeallocateMatrix(m_00,N + 1);
      DeallocateMatrix(m_01,N + 1);
      return 0;
    }
    dStack_58 = ABS(m_00[j][j]);
    B._4_4_ = j;
    for (p = j; p <= N; p = p + 1) {
      if (dStack_58 < ABS(m_00[p][j])) {
        dStack_58 = ABS(m_00[p][j]);
        B._4_4_ = p;
      }
    }
    if (dStack_58 < 1e-19) break;
    if (B._4_4_ != j) {
      for (q = j; q <= N * 2 + 1; q = q + 1) {
        dVar1 = m_00[B._4_4_][q];
        m_00[B._4_4_][q] = m_00[j][q];
        m_00[j][q] = dVar1;
      }
    }
    dVar1 = m_00[j][j];
    for (q = N * 2 + 1; j <= q; q = q + -1) {
      m_00[j][q] = m_00[j][q] / dVar1;
    }
    for (p = 1; p <= N; p = p + 1) {
      if (p != j) {
        dVar1 = m_00[p][j];
        for (q = N * 2 + 1; j <= q; q = q + -1) {
          m_00[p][q] = -dVar1 * m_00[j][q] + m_00[p][q];
        }
      }
    }
    j = j + 1;
  }
  DeallocateMatrix(m,N + 1);
  DeallocateMatrix(m_00,N + 1);
  DeallocateMatrix(m_01,N + 1);
  return -1;
}

Assistant:

int EDCircles::inverse(double ** TB, double ** InvB, int N)
{
	int k, i, j, p, q;
	double mult;
	double D, temp;
	double maxpivot;
	int npivot;
	double **B = AllocateMatrix(N + 1, N + 2);
	double **A = AllocateMatrix(N + 1, 2 * N + 2);
	double **C = AllocateMatrix(N + 1, N + 1);
	double eps = 10e-20;

	for (k = 1; k <= N; k++)
		for (j = 1; j <= N; j++)
			B[k][j] = TB[k][j];

	for (k = 1; k <= N; k++)
	{
		for (j = 1; j <= N + 1; j++)
			A[k][j] = B[k][j];
		for (j = N + 2; j <= 2 * N + 1; j++)
			A[k][j] = (double)0;
		A[k][k - 1 + N + 2] = (double)1;
	}
	for (k = 1; k <= N; k++)
	{
		maxpivot = fabs((double)A[k][k]);
		npivot = k;
		for (i = k; i <= N; i++)
			if (maxpivot < fabs((double)A[i][k]))
			{
				maxpivot = fabs((double)A[i][k]);
				npivot = i;
			}
		if (maxpivot >= eps)
		{
			if (npivot != k)
				for (j = k; j <= 2 * N + 1; j++)
				{
					temp = A[npivot][j];
					A[npivot][j] = A[k][j];
					A[k][j] = temp;
				};
			D = A[k][k];
			for (j = 2 * N + 1; j >= k; j--)
				A[k][j] = A[k][j] / D;
			for (i = 1; i <= N; i++)
			{
				if (i != k)
				{
					mult = A[i][k];
					for (j = 2 * N + 1; j >= k; j--)
						A[i][j] = A[i][j] - mult * A[k][j];
				}
			}
		}
		else
		{  // printf("\n The matrix may be singular !!") ;

			DeallocateMatrix(B, N + 1);
			DeallocateMatrix(A, N + 1);
			DeallocateMatrix(C, N + 1);

			return (-1);
		} //end-else
	}
	/**   Copia il risultato nella matrice InvB  ***/
	for (k = 1, p = 1; k <= N; k++, p++)
		for (j = N + 2, q = 1; j <= 2 * N + 1; j++, q++)
			InvB[p][q] = A[k][j];

	DeallocateMatrix(B, N + 1);
	DeallocateMatrix(A, N + 1);
	DeallocateMatrix(C, N + 1);

	return (0);
}